

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omplexer.cc
# Opt level: O1

void yy_push_state(int _new_state)

{
  size_t __size;
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = yy_start_stack_ptr;
  lVar3 = (long)yy_start_stack_ptr;
  lVar2 = (long)yy_start_stack_depth;
  if (yy_start_stack_depth <= yy_start_stack_ptr) {
    yy_start_stack_depth = yy_start_stack_depth + 0x19;
    __size = lVar2 * 4 + 100;
    if (yy_start_stack == (int *)0x0) {
      yy_start_stack = (int *)malloc(__size);
    }
    else {
      yy_start_stack = (int *)realloc(yy_start_stack,__size);
    }
    if (yy_start_stack == (int *)0x0) {
      yy_fatal_error("out of memory expanding start-condition stack");
    }
  }
  yy_start_stack_ptr = iVar1 + 1;
  yy_start_stack[lVar3] = (yy_start - (yy_start + -1 >> 0x1f)) + -1 >> 1;
  yy_start = _new_state * 2 + 1;
  return;
}

Assistant:

static void yy_push_state (int  _new_state )
{
    	if ( (yy_start_stack_ptr) >= (yy_start_stack_depth) )
		{
		yy_size_t new_size;

		(yy_start_stack_depth) += YY_START_STACK_INCR;
		new_size = (yy_size_t) (yy_start_stack_depth) * sizeof( int );

		if ( ! (yy_start_stack) )
			(yy_start_stack) = (int *) yyalloc( new_size  );

		else
			(yy_start_stack) = (int *) yyrealloc(
					(void *) (yy_start_stack), new_size  );

		if ( ! (yy_start_stack) )
			YY_FATAL_ERROR( "out of memory expanding start-condition stack" );
		}

	(yy_start_stack)[(yy_start_stack_ptr)++] = YY_START;

	BEGIN(_new_state);
}